

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O1

void __thiscall
amrex::PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::resize
          (PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_> *this,size_type a_new_size)

{
  ulong uVar1;
  size_type a_capacity;
  
  uVar1 = this->m_capacity;
  if (uVar1 < a_new_size) {
    a_capacity = 2;
    if (uVar1 != 0) {
      a_capacity = uVar1;
    }
    for (; a_capacity < a_new_size; a_capacity = a_capacity * 3 + 1 >> 1) {
    }
    AllocateBuffer(this,a_capacity);
  }
  this->m_size = a_new_size;
  return;
}

Assistant:

void resize (size_type a_new_size) noexcept
        {
            if (capacity() < a_new_size) AllocateBuffer(GetNewCapacity(a_new_size - capacity()));
            m_size = a_new_size;
        }